

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.cpp
# Opt level: O0

CK_RV __thiscall Token::reAuthenticate(Token *this,ByteString *pin)

{
  _func_int **pp_Var1;
  undefined3 uVar2;
  byte bVar3;
  undefined1 uVar4;
  bool bVar5;
  SecureDataManager *in_RDI;
  MutexLocker lock;
  CK_ULONG flags;
  undefined4 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffac;
  undefined1 in_stack_ffffffffffffffad;
  undefined1 in_stack_ffffffffffffffae;
  undefined1 in_stack_ffffffffffffffaf;
  undefined2 local_20;
  byte bStack_1e;
  undefined5 uStack_1d;
  CK_RV local_8;
  
  MutexLocker::MutexLocker
            ((MutexLocker *)in_RDI,
             (Mutex *)CONCAT17(in_stack_ffffffffffffffaf,
                               CONCAT16(in_stack_ffffffffffffffae,
                                        CONCAT15(in_stack_ffffffffffffffad,
                                                 CONCAT14(in_stack_ffffffffffffffac,
                                                          in_stack_ffffffffffffffa8)))));
  if ((in_RDI->userEncryptedKey).byteString.
      super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start == (pointer)0x0) {
    local_8 = 5;
  }
  else {
    pp_Var1 = (in_RDI->userEncryptedKey).byteString.
              super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>._M_impl.
              super__Tp_alloc_type._vptr_SecureAllocator;
    bVar3 = (**(code **)(*pp_Var1 + 0x20))(pp_Var1,&local_20);
    if ((bVar3 & 1) == 0) {
      softHSMLog(3,"reAuthenticate",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/slot_mgr/Token.cpp"
                 ,200,"Could not get the token flags");
      local_8 = 5;
    }
    else {
      uVar4 = SecureDataManager::isSOLoggedIn
                        ((SecureDataManager *)
                         (in_RDI->userEncryptedKey).byteString.
                         super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start);
      if ((bool)uVar4) {
        bVar5 = SecureDataManager::reAuthenticateSO
                          (in_RDI,(ByteString *)
                                  CONCAT17(bVar3,CONCAT16(uVar4,CONCAT15(in_stack_ffffffffffffffad,
                                                                         CONCAT14(
                                                  in_stack_ffffffffffffffac,
                                                  in_stack_ffffffffffffffa8)))));
        if (!bVar5) {
          pp_Var1 = (in_RDI->userEncryptedKey).byteString.
                    super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>._M_impl.
                    super__Tp_alloc_type._vptr_SecureAllocator;
          uVar2 = CONCAT12(bStack_1e,local_20);
          bStack_1e = bStack_1e | 0x10;
          (**(code **)(*pp_Var1 + 0x28))(pp_Var1,CONCAT53(uStack_1d,uVar2) | 0x100000);
          local_8 = 0xa0;
          goto LAB_001ed71c;
        }
        pp_Var1 = (in_RDI->userEncryptedKey).byteString.
                  super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>._M_impl.
                  super__Tp_alloc_type._vptr_SecureAllocator;
        uVar2 = CONCAT12(bStack_1e,local_20);
        bStack_1e = bStack_1e & 0xef;
        (**(code **)(*pp_Var1 + 0x28))(pp_Var1,CONCAT53(uStack_1d,uVar2) & 0xffffffffffefffff);
      }
      else {
        bVar5 = SecureDataManager::isUserLoggedIn
                          ((SecureDataManager *)
                           (in_RDI->userEncryptedKey).byteString.
                           super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>.
                           _M_impl.super__Vector_impl_data._M_start);
        if (!bVar5) {
          local_8 = 0x91;
          goto LAB_001ed71c;
        }
        bVar5 = SecureDataManager::reAuthenticateUser
                          (in_RDI,(ByteString *)
                                  CONCAT17(bVar3,CONCAT16(uVar4,CONCAT15(in_stack_ffffffffffffffad,
                                                                         CONCAT14(bVar5,
                                                  in_stack_ffffffffffffffa8)))));
        if (!bVar5) {
          pp_Var1 = (in_RDI->userEncryptedKey).byteString.
                    super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>._M_impl.
                    super__Tp_alloc_type._vptr_SecureAllocator;
          uVar2 = CONCAT12(bStack_1e,local_20);
          bStack_1e = bStack_1e | 1;
          (**(code **)(*pp_Var1 + 0x28))(pp_Var1,CONCAT53(uStack_1d,uVar2) | 0x10000);
          local_8 = 0xa0;
          goto LAB_001ed71c;
        }
        pp_Var1 = (in_RDI->userEncryptedKey).byteString.
                  super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>._M_impl.
                  super__Tp_alloc_type._vptr_SecureAllocator;
        uVar2 = CONCAT12(bStack_1e,local_20);
        bStack_1e = bStack_1e & 0xfe;
        (**(code **)(*pp_Var1 + 0x28))(pp_Var1,CONCAT53(uStack_1d,uVar2) & 0xfffffffffffeffff);
      }
      local_8 = 0;
    }
  }
LAB_001ed71c:
  MutexLocker::~MutexLocker((MutexLocker *)in_RDI);
  return local_8;
}

Assistant:

CK_RV Token::reAuthenticate(ByteString& pin)
{
	CK_ULONG flags;

	// Lock access to the token
	MutexLocker lock(tokenMutex);

	if (sdm == NULL) return CKR_GENERAL_ERROR;

	// Get token flags
	if (!token->getTokenFlags(flags))
	{
		ERROR_MSG("Could not get the token flags");
		return CKR_GENERAL_ERROR;
	}

	if (sdm->isSOLoggedIn())
	{
		// Login
		if (!sdm->reAuthenticateSO(pin))
		{
			flags |= CKF_SO_PIN_COUNT_LOW;
			token->setTokenFlags(flags);
			return CKR_PIN_INCORRECT;
		}
		else
		{
			flags &= ~CKF_SO_PIN_COUNT_LOW;
			token->setTokenFlags(flags);
		}
	}
	else if (sdm->isUserLoggedIn())
	{
		// Login
		if (!sdm->reAuthenticateUser(pin))
		{
			flags |= CKF_USER_PIN_COUNT_LOW;
			token->setTokenFlags(flags);
			return CKR_PIN_INCORRECT;
		}
		else
		{
			flags &= ~CKF_USER_PIN_COUNT_LOW;
			token->setTokenFlags(flags);
		}
	}
	else
	{
		return CKR_OPERATION_NOT_INITIALIZED;
	}

	return CKR_OK;
}